

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O0

FT_Error woff_open_font(FT_Stream stream,TT_Face face)

{
  FT_Memory memory_00;
  int iVar1;
  FT_ULong FVar2;
  undefined1 *puVar3;
  FT_ULong local_100;
  FT_ULong output_len;
  WOFF_Table table_2;
  WOFF_Table table_1;
  WOFF_Table table;
  FT_UInt x;
  FT_UInt rangeShift;
  FT_UInt entrySelector;
  FT_UInt searchRange;
  FT_ULong old_tag;
  ulong uStack_c0;
  FT_Int nn;
  FT_ULong sfnt_offset;
  FT_Byte *sfnt_header;
  FT_Stream sfnt_stream;
  FT_Byte *sfnt;
  FT_ULong woff_offset;
  WOFF_Table *indices;
  WOFF_Table tables;
  WOFF_HeaderRec woff;
  FT_Error error;
  FT_Memory memory;
  TT_Face face_local;
  FT_Stream stream_local;
  
  memory_00 = stream->memory;
  woff.privLength._4_4_ = 0;
  indices = (WOFF_Table *)0x0;
  woff_offset = 0;
  sfnt_stream = (FT_Stream)0x0;
  sfnt_header = (FT_Byte *)0x0;
  _entrySelector = 0;
  woff.privLength._4_4_ = FT_Stream_ReadFields(stream,woff_open_font::woff_header_fields,&tables);
  if (woff.privLength._4_4_ != 0) {
    return woff.privLength._4_4_;
  }
  if ((woff.signature == 0x774f4646) || (woff.signature == 0x74746366)) {
    return 8;
  }
  if (((((((woff.flavor != stream->size) || ((ushort)woff.length == 0)) ||
         (woff.flavor <= (ulong)(ushort)woff.length * 0x14 + 0x2c)) ||
        (((ulong)woff._24_8_ <= (ulong)(ushort)woff.length * 0x10 + 0xc || ((woff._24_8_ & 3) != 0))
        )) || ((woff._40_8_ == 0 && ((woff.metaOffset != 0 || (woff.metaLength != 0)))))) ||
      ((woff.metaOffset != 0 && (woff.metaLength == 0)))) ||
     ((woff.metaOrigLength == 0 && (woff.privOffset != 0)))) {
    return 8;
  }
  sfnt_stream = (FT_Stream)
                ft_mem_alloc(memory_00,(ulong)(ushort)woff.length * 0x10 + 0xc,
                             (FT_Error *)((long)&woff.privLength + 4));
  if ((woff.privLength._4_4_ == 0) &&
     (sfnt_header = (FT_Byte *)ft_mem_alloc(memory_00,0x50,(FT_Error *)((long)&woff.privLength + 4))
     , woff.privLength._4_4_ == 0)) {
    x = 0;
    for (table._0_4_ = (uint)(ushort)woff.length; (uint)table != 0; table._0_4_ = (uint)table >> 1)
    {
      x = x + 1;
    }
    x = x - 1;
    iVar1 = 1 << ((byte)x & 0x1f);
    rangeShift = iVar1 * 0x10;
    table._4_4_ = (uint)(ushort)woff.length * 0x10 + iVar1 * -0x10;
    *(char *)&sfnt_stream->base = (char)((uint)(undefined4)woff.signature >> 0x18);
    *(char *)((long)&sfnt_stream->base + 1) = (char)((uint)(undefined4)woff.signature >> 0x10);
    *(char *)((long)&sfnt_stream->base + 2) = (char)((uint)(undefined4)woff.signature >> 8);
    *(char *)((long)&sfnt_stream->base + 3) = (char)(undefined4)woff.signature;
    *(char *)((long)&sfnt_stream->base + 4) = (char)((ushort)woff.length >> 8);
    *(char *)((long)&sfnt_stream->base + 5) = (char)(ushort)woff.length;
    *(char *)((long)&sfnt_stream->base + 6) = (char)(rangeShift >> 8);
    *(char *)((long)&sfnt_stream->base + 7) = (char)rangeShift;
    *(char *)&sfnt_stream->size = (char)(x >> 8);
    *(byte *)((long)&sfnt_stream->size + 1) = (byte)x;
    *(char *)((long)&sfnt_stream->size + 2) = (char)((uint)table._4_4_ >> 8);
    sfnt_offset = (long)&sfnt_stream->size + 4;
    *(char *)((long)&sfnt_stream->size + 3) = (char)table._4_4_;
    indices = (WOFF_Table *)
              ft_mem_realloc(memory_00,0x30,0,(ulong)(ushort)woff.length,(void *)0x0,
                             (FT_Error *)((long)&woff.privLength + 4));
    if (((woff.privLength._4_4_ == 0) &&
        (woff_offset = (FT_ULong)
                       ft_mem_realloc(memory_00,8,0,(ulong)(ushort)woff.length,(void *)0x0,
                                      (FT_Error *)((long)&woff.privLength + 4)),
        woff.privLength._4_4_ == 0)) &&
       (woff.privLength._4_4_ = FT_Stream_EnterFrame(stream,(ulong)(ushort)woff.length * 0x14),
       woff.privLength._4_4_ == 0)) {
      for (old_tag._4_4_ = 0; old_tag._4_4_ < (int)(uint)(ushort)woff.length;
          old_tag._4_4_ = old_tag._4_4_ + 1) {
        table_1 = (WOFF_Table)(indices + (long)old_tag._4_4_ * 6);
        FVar2 = FT_Stream_GetULong(stream);
        table_1->Tag = FVar2;
        FVar2 = FT_Stream_GetULong(stream);
        table_1->Offset = FVar2;
        FVar2 = FT_Stream_GetULong(stream);
        table_1->CompLength = FVar2;
        FVar2 = FT_Stream_GetULong(stream);
        table_1->OrigLength = FVar2;
        FVar2 = FT_Stream_GetULong(stream);
        table_1->CheckSum = FVar2;
        if (table_1->Tag <= _entrySelector) {
          FT_Stream_ExitFrame(stream);
          woff.privLength._4_4_ = 8;
          goto LAB_00326d57;
        }
        _entrySelector = table_1->Tag;
        *(WOFF_Table *)(woff_offset + (long)old_tag._4_4_ * 8) = table_1;
      }
      FT_Stream_ExitFrame(stream);
      qsort((void *)woff_offset,(ulong)(ushort)woff.length,8,compare_offsets);
      sfnt = (FT_Byte *)((ulong)(ushort)woff.length * 0x14 + 0x2c);
      uStack_c0 = (ulong)(ushort)woff.length * 0x10 + 0xc;
      for (old_tag._4_4_ = 0; old_tag._4_4_ < (int)(uint)(ushort)woff.length;
          old_tag._4_4_ = old_tag._4_4_ + 1) {
        table_2 = *(WOFF_Table *)(woff_offset + (long)old_tag._4_4_ * 8);
        if (((((FT_Byte *)table_2->Offset != sfnt) || (woff.flavor < table_2->CompLength)) ||
            ((woff.flavor - table_2->CompLength < table_2->Offset ||
             (((ulong)woff._24_8_ < table_2->OrigLength ||
              (woff._24_8_ - table_2->OrigLength < uStack_c0)))))) ||
           (table_2->OrigLength < table_2->CompLength)) {
          woff.privLength._4_4_ = 8;
          goto LAB_00326d57;
        }
        table_2->OrigOffset = uStack_c0;
        sfnt = sfnt + (table_2->CompLength + 3 & 0xfffffffc);
        uStack_c0 = (table_2->OrigLength + 3 & 0xfffffffc) + uStack_c0;
      }
      if (woff._40_8_ != 0) {
        if (((FT_Byte *)woff._40_8_ != sfnt) || (woff.flavor < woff._40_8_ + woff.metaOffset)) {
          woff.privLength._4_4_ = 8;
          goto LAB_00326d57;
        }
        sfnt = sfnt + woff.metaOffset;
      }
      if (woff.metaOrigLength != 0) {
        sfnt = (FT_Byte *)((ulong)(sfnt + 3) & 0xfffffffc);
        if (((FT_Byte *)woff.metaOrigLength != sfnt) ||
           (woff.flavor < woff.metaOrigLength + woff.privOffset)) {
          woff.privLength._4_4_ = 8;
          goto LAB_00326d57;
        }
        sfnt = sfnt + woff.privOffset;
      }
      if ((uStack_c0 == woff._24_8_) && (sfnt == (FT_Byte *)woff.flavor)) {
        sfnt_stream = (FT_Stream)
                      ft_mem_realloc(memory_00,1,(ulong)(ushort)woff.length * 0x10 + 0xc,woff._24_8_
                                     ,sfnt_stream,(FT_Error *)((long)&woff.privLength + 4));
        if (woff.privLength._4_4_ == 0) {
          sfnt_offset = (long)&sfnt_stream->size + 4;
          for (old_tag._4_4_ = 0; old_tag._4_4_ < (int)(uint)(ushort)woff.length;
              old_tag._4_4_ = old_tag._4_4_ + 1) {
            output_len = (FT_ULong)(indices + (long)old_tag._4_4_ * 6);
            *(char *)sfnt_offset = (char)((ulong)*(WOFF_Table *)output_len >> 0x18);
            *(char *)(sfnt_offset + 1) = (char)((ulong)*(WOFF_Table *)output_len >> 0x10);
            *(char *)(sfnt_offset + 2) = (char)((ulong)*(WOFF_Table *)output_len >> 8);
            *(char *)(sfnt_offset + 3) = (char)*(WOFF_Table *)output_len;
            *(char *)(sfnt_offset + 4) = (char)((ulong)*(WOFF_Table *)(output_len + 0x20) >> 0x18);
            *(char *)(sfnt_offset + 5) = (char)((ulong)*(WOFF_Table *)(output_len + 0x20) >> 0x10);
            *(char *)(sfnt_offset + 6) = (char)((ulong)*(WOFF_Table *)(output_len + 0x20) >> 8);
            *(char *)(sfnt_offset + 7) = (char)*(WOFF_Table *)(output_len + 0x20);
            *(char *)(sfnt_offset + 8) = (char)((ulong)*(WOFF_Table *)(output_len + 0x28) >> 0x18);
            *(char *)(sfnt_offset + 9) = (char)((ulong)*(WOFF_Table *)(output_len + 0x28) >> 0x10);
            *(char *)(sfnt_offset + 10) = (char)((ulong)*(WOFF_Table *)(output_len + 0x28) >> 8);
            *(char *)(sfnt_offset + 0xb) = (char)*(WOFF_Table *)(output_len + 0x28);
            *(char *)(sfnt_offset + 0xc) = (char)((ulong)*(WOFF_Table *)(output_len + 0x18) >> 0x18)
            ;
            *(char *)(sfnt_offset + 0xd) = (char)((ulong)*(WOFF_Table *)(output_len + 0x18) >> 0x10)
            ;
            puVar3 = (undefined1 *)(sfnt_offset + 0xf);
            *(char *)(sfnt_offset + 0xe) = (char)((ulong)*(WOFF_Table *)(output_len + 0x18) >> 8);
            sfnt_offset = sfnt_offset + 0x10;
            *puVar3 = (char)*(WOFF_Table *)(output_len + 0x18);
            woff.privLength._4_4_ = FT_Stream_Seek(stream,(FT_ULong)*(WOFF_Table *)(output_len + 8))
            ;
            if ((woff.privLength._4_4_ != 0) ||
               (woff.privLength._4_4_ =
                     FT_Stream_EnterFrame(stream,*(FT_ULong *)(output_len + 0x10)),
               woff.privLength._4_4_ != 0)) goto LAB_00326d57;
            if (*(long *)(output_len + 0x10) == *(long *)(output_len + 0x18)) {
              memcpy((void *)((long)&sfnt_stream->base + *(long *)(output_len + 0x28)),
                     stream->cursor,*(size_t *)(output_len + 0x18));
            }
            else {
              local_100 = *(FT_ULong *)(output_len + 0x18);
              woff.privLength._4_4_ =
                   FT_Gzip_Uncompress(memory_00,
                                      (FT_Byte *)
                                      ((long)&sfnt_stream->base + *(long *)(output_len + 0x28)),
                                      &local_100,stream->cursor,*(FT_ULong *)(output_len + 0x10));
              if (woff.privLength._4_4_ != 0) goto LAB_00326d57;
              if (local_100 != *(FT_ULong *)(output_len + 0x18)) {
                woff.privLength._4_4_ = 8;
                goto LAB_00326d57;
              }
            }
            FT_Stream_ExitFrame(stream);
            for (uStack_c0 = *(long *)(output_len + 0x28) + *(long *)(output_len + 0x18);
                (uStack_c0 & 3) != 0; uStack_c0 = uStack_c0 + 1) {
              *(undefined1 *)((long)&sfnt_stream->base + uStack_c0) = 0;
            }
          }
          FT_Stream_OpenMemory((FT_Stream)sfnt_header,(FT_Byte *)sfnt_stream,woff._24_8_);
          *(FT_Memory *)(sfnt_header + 0x38) = stream->memory;
          *(code **)(sfnt_header + 0x30) = sfnt_stream_close;
          FT_Stream_Free((face->root).stream,(uint)(((face->root).face_flags & 0x400U) != 0));
          (face->root).stream = (FT_Stream)sfnt_header;
          (face->root).face_flags = (face->root).face_flags & 0xfffffffffffffbff;
        }
      }
      else {
        woff.privLength._4_4_ = 8;
      }
    }
  }
LAB_00326d57:
  ft_mem_free(memory_00,indices);
  indices = (WOFF_Table *)0x0;
  ft_mem_free(memory_00,(void *)woff_offset);
  woff_offset = 0;
  if (woff.privLength._4_4_ != 0) {
    ft_mem_free(memory_00,sfnt_stream);
    sfnt_stream = (FT_Stream)0x0;
    FT_Stream_Close((FT_Stream)sfnt_header);
    ft_mem_free(memory_00,sfnt_header);
  }
  return woff.privLength._4_4_;
}

Assistant:

static FT_Error
  woff_open_font( FT_Stream  stream,
                  TT_Face    face )
  {
    FT_Memory       memory = stream->memory;
    FT_Error        error  = FT_Err_Ok;

    WOFF_HeaderRec  woff;
    WOFF_Table      tables  = NULL;
    WOFF_Table*     indices = NULL;

    FT_ULong        woff_offset;

    FT_Byte*        sfnt        = NULL;
    FT_Stream       sfnt_stream = NULL;

    FT_Byte*        sfnt_header;
    FT_ULong        sfnt_offset;

    FT_Int          nn;
    FT_ULong        old_tag = 0;

    static const FT_Frame_Field  woff_header_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  WOFF_HeaderRec

      FT_FRAME_START( 44 ),
        FT_FRAME_ULONG ( signature ),
        FT_FRAME_ULONG ( flavor ),
        FT_FRAME_ULONG ( length ),
        FT_FRAME_USHORT( num_tables ),
        FT_FRAME_USHORT( reserved ),
        FT_FRAME_ULONG ( totalSfntSize ),
        FT_FRAME_USHORT( majorVersion ),
        FT_FRAME_USHORT( minorVersion ),
        FT_FRAME_ULONG ( metaOffset ),
        FT_FRAME_ULONG ( metaLength ),
        FT_FRAME_ULONG ( metaOrigLength ),
        FT_FRAME_ULONG ( privOffset ),
        FT_FRAME_ULONG ( privLength ),
      FT_FRAME_END
    };


    FT_ASSERT( stream == face->root.stream );
    FT_ASSERT( FT_STREAM_POS() == 0 );

    if ( FT_STREAM_READ_FIELDS( woff_header_fields, &woff ) )
      return error;

    /* Make sure we don't recurse back here or hit TTC code. */
    if ( woff.flavor == TTAG_wOFF || woff.flavor == TTAG_ttcf )
      return FT_THROW( Invalid_Table );

    /* Miscellaneous checks. */
    if ( woff.length != stream->size                              ||
         woff.num_tables == 0                                     ||
         44 + woff.num_tables * 20UL >= woff.length               ||
         12 + woff.num_tables * 16UL >= woff.totalSfntSize        ||
         ( woff.totalSfntSize & 3 ) != 0                          ||
         ( woff.metaOffset == 0 && ( woff.metaLength != 0     ||
                                     woff.metaOrigLength != 0 ) ) ||
         ( woff.metaLength != 0 && woff.metaOrigLength == 0 )     ||
         ( woff.privOffset == 0 && woff.privLength != 0 )         )
    {
      FT_ERROR(( "woff_font_open: invalid WOFF header\n" ));
      return FT_THROW( Invalid_Table );
    }

    /* Don't trust `totalSfntSize' before thorough checks. */
    if ( FT_ALLOC( sfnt, 12 + woff.num_tables * 16UL ) ||
         FT_NEW( sfnt_stream )                         )
      goto Exit;

    sfnt_header = sfnt;

    /* Write sfnt header. */
    {
      FT_UInt  searchRange, entrySelector, rangeShift, x;


      x             = woff.num_tables;
      entrySelector = 0;
      while ( x )
      {
        x            >>= 1;
        entrySelector += 1;
      }
      entrySelector--;

      searchRange = ( 1 << entrySelector ) * 16;
      rangeShift  = woff.num_tables * 16 - searchRange;

      WRITE_ULONG ( sfnt_header, woff.flavor );
      WRITE_USHORT( sfnt_header, woff.num_tables );
      WRITE_USHORT( sfnt_header, searchRange );
      WRITE_USHORT( sfnt_header, entrySelector );
      WRITE_USHORT( sfnt_header, rangeShift );
    }

    /* While the entries in the sfnt header must be sorted by the */
    /* tag value, the tables themselves are not.  We thus have to */
    /* sort them by offset and check that they don't overlap.     */

    if ( FT_NEW_ARRAY( tables, woff.num_tables )  ||
         FT_NEW_ARRAY( indices, woff.num_tables ) )
      goto Exit;

    FT_TRACE2(( "\n"
                "  tag    offset    compLen  origLen  checksum\n"
                "  -------------------------------------------\n" ));

    if ( FT_FRAME_ENTER( 20L * woff.num_tables ) )
      goto Exit;

    for ( nn = 0; nn < woff.num_tables; nn++ )
    {
      WOFF_Table  table = tables + nn;

      table->Tag        = FT_GET_TAG4();
      table->Offset     = FT_GET_ULONG();
      table->CompLength = FT_GET_ULONG();
      table->OrigLength = FT_GET_ULONG();
      table->CheckSum   = FT_GET_ULONG();

      FT_TRACE2(( "  %c%c%c%c  %08lx  %08lx  %08lx  %08lx\n",
                  (FT_Char)( table->Tag >> 24 ),
                  (FT_Char)( table->Tag >> 16 ),
                  (FT_Char)( table->Tag >> 8  ),
                  (FT_Char)( table->Tag       ),
                  table->Offset,
                  table->CompLength,
                  table->OrigLength,
                  table->CheckSum ));

      if ( table->Tag <= old_tag )
      {
        FT_FRAME_EXIT();

        FT_ERROR(( "woff_font_open: table tags are not sorted\n" ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      old_tag     = table->Tag;
      indices[nn] = table;
    }

    FT_FRAME_EXIT();

    /* Sort by offset. */

    ft_qsort( indices,
              woff.num_tables,
              sizeof ( WOFF_Table ),
              compare_offsets );

    /* Check offsets and lengths. */

    woff_offset = 44 + woff.num_tables * 20L;
    sfnt_offset = 12 + woff.num_tables * 16L;

    for ( nn = 0; nn < woff.num_tables; nn++ )
    {
      WOFF_Table  table = indices[nn];


      if ( table->Offset != woff_offset                         ||
           table->CompLength > woff.length                      ||
           table->Offset > woff.length - table->CompLength      ||
           table->OrigLength > woff.totalSfntSize               ||
           sfnt_offset > woff.totalSfntSize - table->OrigLength ||
           table->CompLength > table->OrigLength                )
      {
        FT_ERROR(( "woff_font_open: invalid table offsets\n" ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      table->OrigOffset = sfnt_offset;

      /* The offsets must be multiples of 4. */
      woff_offset += ( table->CompLength + 3 ) & ~3U;
      sfnt_offset += ( table->OrigLength + 3 ) & ~3U;
    }

    /*
     * Final checks!
     *
     * We don't decode and check the metadata block.
     * We don't check table checksums either.
     * But other than those, I think we implement all
     * `MUST' checks from the spec.
     */

    if ( woff.metaOffset )
    {
      if ( woff.metaOffset != woff_offset                  ||
           woff.metaOffset + woff.metaLength > woff.length )
      {
        FT_ERROR(( "woff_font_open:"
                   " invalid `metadata' offset or length\n" ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      /* We have padding only ... */
      woff_offset += woff.metaLength;
    }

    if ( woff.privOffset )
    {
      /* ... if it isn't the last block. */
      woff_offset = ( woff_offset + 3 ) & ~3U;

      if ( woff.privOffset != woff_offset                  ||
           woff.privOffset + woff.privLength > woff.length )
      {
        FT_ERROR(( "woff_font_open: invalid `private' offset or length\n" ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      /* No padding for the last block. */
      woff_offset += woff.privLength;
    }

    if ( sfnt_offset != woff.totalSfntSize ||
         woff_offset != woff.length        )
    {
      FT_ERROR(( "woff_font_open: invalid `sfnt' table structure\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    /* Now use `totalSfntSize'. */
    if ( FT_REALLOC( sfnt,
                     12 + woff.num_tables * 16UL,
                     woff.totalSfntSize ) )
      goto Exit;

    sfnt_header = sfnt + 12;

    /* Write the tables. */

    for ( nn = 0; nn < woff.num_tables; nn++ )
    {
      WOFF_Table  table = tables + nn;


      /* Write SFNT table entry. */
      WRITE_ULONG( sfnt_header, table->Tag );
      WRITE_ULONG( sfnt_header, table->CheckSum );
      WRITE_ULONG( sfnt_header, table->OrigOffset );
      WRITE_ULONG( sfnt_header, table->OrigLength );

      /* Write table data. */
      if ( FT_STREAM_SEEK( table->Offset )     ||
           FT_FRAME_ENTER( table->CompLength ) )
        goto Exit;

      if ( table->CompLength == table->OrigLength )
      {
        /* Uncompressed data; just copy. */
        ft_memcpy( sfnt + table->OrigOffset,
                   stream->cursor,
                   table->OrigLength );
      }
      else
      {
#ifdef FT_CONFIG_OPTION_USE_ZLIB

        /* Uncompress with zlib. */
        FT_ULong  output_len = table->OrigLength;


        error = FT_Gzip_Uncompress( memory,
                                    sfnt + table->OrigOffset, &output_len,
                                    stream->cursor, table->CompLength );
        if ( error )
          goto Exit;
        if ( output_len != table->OrigLength )
        {
          FT_ERROR(( "woff_font_open: compressed table length mismatch\n" ));
          error = FT_THROW( Invalid_Table );
          goto Exit;
        }

#else /* !FT_CONFIG_OPTION_USE_ZLIB */

        error = FT_THROW( Unimplemented_Feature );
        goto Exit;

#endif /* !FT_CONFIG_OPTION_USE_ZLIB */
      }

      FT_FRAME_EXIT();

      /* We don't check whether the padding bytes in the WOFF file are     */
      /* actually '\0'.  For the output, however, we do set them properly. */
      sfnt_offset = table->OrigOffset + table->OrigLength;
      while ( sfnt_offset & 3 )
      {
        sfnt[sfnt_offset] = '\0';
        sfnt_offset++;
      }
    }

    /* Ok!  Finally ready.  Swap out stream and return. */
    FT_Stream_OpenMemory( sfnt_stream, sfnt, woff.totalSfntSize );
    sfnt_stream->memory = stream->memory;
    sfnt_stream->close  = sfnt_stream_close;

    FT_Stream_Free(
      face->root.stream,
      ( face->root.face_flags & FT_FACE_FLAG_EXTERNAL_STREAM ) != 0 );

    face->root.stream = sfnt_stream;

    face->root.face_flags &= ~FT_FACE_FLAG_EXTERNAL_STREAM;

  Exit:
    FT_FREE( tables );
    FT_FREE( indices );

    if ( error )
    {
      FT_FREE( sfnt );
      FT_Stream_Close( sfnt_stream );
      FT_FREE( sfnt_stream );
    }

    return error;
  }